

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>::
disposeImpl(HeapDisposer<kj::_::AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>_>
            *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter>::~AdapterPromiseNode
              ((AdapterPromiseNode<kj::_::Void,_kj::TimerImpl::TimerPromiseAdapter> *)pointer);
  }
  operator_delete(pointer,0x1a8);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }